

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_allocator_nginx.c
# Opt level: O1

memory_allocator
memory_allocator_nginx
          (void *pool,memory_allocator_nginx_impl_palloc palloc,
          memory_allocator_nginx_impl_pcopy pcopy,memory_allocator_nginx_impl_pfree pfree)

{
  memory_allocator_iface iface;
  memory_allocator pmVar1;
  memory_allocator_nginx_ctx_type nginx_ctx;
  void *local_28;
  memory_allocator_nginx_impl_palloc local_20;
  memory_allocator_nginx_impl_pcopy local_18;
  memory_allocator_nginx_impl_pfree local_10;
  
  local_28 = pool;
  local_20 = palloc;
  local_18 = pcopy;
  local_10 = pfree;
  iface = memory_allocator_nginx_iface();
  pmVar1 = memory_allocator_create(iface,&local_28);
  return pmVar1;
}

Assistant:

memory_allocator memory_allocator_nginx(void *pool, memory_allocator_nginx_impl_palloc palloc, memory_allocator_nginx_impl_pcopy pcopy, memory_allocator_nginx_impl_pfree pfree)
{
	struct memory_allocator_nginx_ctx_type nginx_ctx;

	nginx_ctx.pool = pool;
	nginx_ctx.palloc = palloc;
	nginx_ctx.pcopy = pcopy;
	nginx_ctx.pfree = pfree;

	return memory_allocator_create(memory_allocator_nginx_iface(), &nginx_ctx);
}